

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfinityTests.cpp
# Opt level: O2

void __thiscall IsInfinityTests::IsInfinityTests(IsInfinityTests *this)

{
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__TestFixture_0027ead8;
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Infinity(0.0f) is False", []() {
			AssertThat(ut11::Is::Infinity(0.0f), ut11::Is::False);
		});

		Then("Is::Infinity(Infinity) is True", []() {
			AssertThat(ut11::Is::Infinity(std::numeric_limits<float>::infinity()), ut11::Is::True);
			AssertThat(ut11::Is::Infinity(-std::numeric_limits<float>::infinity()), ut11::Is::True);
		});

		Then("Is::Infinity is Operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Infinity) >::value, ut11::Is::True);
		});

		Then("Is::Infinity has an error message", []() {
			AssertThat(ut11::Is::Infinity.GetErrorMessage(0.0f), ut11::Is::Not::EqualTo(""));
		});
	}